

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O2

void barrett_reduction(uint64_t *z,uint64_t *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint64_t uVar35;
  uint64_t uVar36;
  uint64_t uVar37;
  uint64_t uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  long lVar50;
  uint64_t uVar51;
  long lVar52;
  uint64_t uVar53;
  uint64_t uVar54;
  long lVar55;
  ulong uVar56;
  uint64_t uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong local_190;
  long local_188;
  
  uVar56 = t[4] >> 0x18 | (ulong)((uint)t[5] & 0xffffff) << 0x20;
  uVar63 = t[5] >> 0x18 | (ulong)((uint)t[6] & 0xffffff) << 0x20;
  uVar62 = t[6] >> 0x18 | (ulong)((uint)t[7] & 0xffffff) << 0x20;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar56;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar56;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar56;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar56;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar56;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar63;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar63;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar63;
  uVar59 = t[7] >> 0x18 | (ulong)((uint)t[8] & 0xffffff) << 0x20;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar63;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar63;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar62;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar62;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar62;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar62;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar62;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar59;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar59;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar59;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar59;
  uVar56 = t[8] >> 0x18 | (ulong)((uint)t[9] & 0xffffff) << 0x20;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar59;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar56;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar56;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar56;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar56;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar56;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       SUB168(auVar1 * ZEXT816(0x9ce5a30a2c131b),8) << 8 |
       SUB168(auVar1 * ZEXT816(0x9ce5a30a2c131b),0) >> 0x38;
  auVar45 = auVar2 * ZEXT816(0x215d086329a7ed) + auVar6 * ZEXT816(0x9ce5a30a2c131b) + auVar45;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auVar45._8_8_ * 0x100 | auVar45._0_8_ >> 0x38;
  auVar48 = auVar11 * ZEXT816(0x9ce5a30a2c131b) +
            auVar3 * ZEXT816(0xffffffffeb2106) + auVar7 * ZEXT816(0x215d086329a7ed) + auVar48;
  uVar56 = auVar48._8_8_;
  auVar49._8_8_ = uVar56 >> 0x38;
  auVar49._0_8_ = uVar56 * 0x100 | auVar48._0_8_ >> 0x38;
  auVar49 = auVar16 * ZEXT816(0x9ce5a30a2c131b) +
            auVar12 * ZEXT816(0x215d086329a7ed) +
            auVar4 * ZEXT816(0xffffffffffffff) + auVar8 * ZEXT816(0xffffffffeb2106) + auVar49;
  uVar56 = auVar49._8_8_;
  auVar40._8_8_ = uVar56 >> 0x38;
  auVar40._0_8_ = uVar56 * 0x100 | auVar49._0_8_ >> 0x38;
  auVar40 = auVar5 * ZEXT816(0xfffffffff) + auVar9 * ZEXT816(0xffffffffffffff) +
            auVar13 * ZEXT816(0xffffffffeb2106) + auVar17 * ZEXT816(0x215d086329a7ed) +
            auVar21 * ZEXT816(0x9ce5a30a2c131b) + auVar40;
  uVar56 = auVar40._0_8_;
  uVar59 = auVar40._8_8_;
  auVar41._8_8_ = uVar59 >> 0x38;
  auVar41._0_8_ = uVar59 * 0x100 | uVar56 >> 0x38;
  auVar41 = auVar22 * ZEXT816(0x215d086329a7ed) +
            auVar18 * ZEXT816(0xffffffffeb2106) +
            auVar14 * ZEXT816(0xffffffffffffff) + auVar10 * ZEXT816(0xfffffffff) + auVar41;
  uVar60 = auVar41._0_8_;
  uVar59 = auVar41._8_8_;
  auVar46._8_8_ = uVar59 >> 0x38;
  auVar46._0_8_ = uVar59 * 0x100 | uVar60 >> 0x38;
  auVar46 = auVar23 * ZEXT816(0xffffffffeb2106) +
            auVar15 * ZEXT816(0xfffffffff) + auVar19 * ZEXT816(0xffffffffffffff) + auVar46;
  uVar59 = auVar46._0_8_;
  uVar62 = auVar46._8_8_;
  auVar47._8_8_ = uVar62 >> 0x38;
  auVar47._0_8_ = uVar62 * 0x100 | uVar59 >> 0x38;
  auVar47 = auVar20 * ZEXT816(0xfffffffff) + auVar24 * ZEXT816(0xffffffffffffff) + auVar47;
  uVar58 = auVar47._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar47._8_8_ * 0x100 | uVar58 >> 0x38;
  auVar39 = auVar25 * ZEXT816(0xfffffffff) + auVar39;
  uVar62 = auVar39._0_8_;
  uVar63 = uVar56 >> 0x28 & 0xffff | (uVar60 & 0xffffffffff) << 0x10;
  uVar61 = uVar60 >> 0x28 & 0xffff | (uVar59 & 0xffffffffff) << 0x10;
  uVar60 = uVar59 >> 0x28 & 0xffff | (uVar58 & 0xffffffffff) << 0x10;
  uVar58 = uVar58 >> 0x28 & 0xffff | uVar62 * 0x10000 & 0xffffffffff0000;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar63;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar63;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar63;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar61;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar61;
  uVar56 = t[4] & 0xffffffffff;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar61;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar60;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar60;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar58;
  local_190 = SUB168(auVar26 * ZEXT816(0x12631a5cf5d3ed),0);
  local_188 = SUB168(auVar26 * ZEXT816(0x12631a5cf5d3ed),8);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_188 << 8 | local_190 >> 0x38;
  auVar42 = auVar27 * ZEXT816(0xf9dea2f79cd658) + auVar29 * ZEXT816(0x12631a5cf5d3ed) + auVar42;
  uVar64 = auVar42._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar42._8_8_ * 0x100 | uVar64 >> 0x38;
  auVar43 = auVar28 * ZEXT816(0x14de) + auVar30 * ZEXT816(0xf9dea2f79cd658) +
            auVar32 * ZEXT816(0x12631a5cf5d3ed) + auVar43;
  uVar59 = auVar43._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar43._8_8_ * 0x100 | uVar59 >> 0x38;
  auVar44 = auVar34 * ZEXT816(0x12631a5cf5d3ed) +
            auVar31 * ZEXT816(0x14de) + auVar33 * ZEXT816(0xf9dea2f79cd658) + auVar44;
  uVar61 = auVar44._0_8_;
  lVar52 = *t - (local_190 & 0xffffffffffffff);
  lVar50 = -(lVar52 >> 0x3f);
  uVar51 = (lVar50 << 0x38) + lVar52;
  lVar52 = t[1] - ((uVar64 & 0xffffffffffffff) + lVar50);
  lVar50 = -(lVar52 >> 0x3f);
  uVar53 = (lVar50 << 0x38) + lVar52;
  lVar52 = t[2] - ((uVar59 & 0xffffffffffffff) + lVar50);
  lVar50 = -(lVar52 >> 0x3f);
  uVar54 = (lVar50 << 0x38) + lVar52;
  lVar52 = t[3] - ((uVar61 & 0xffffffffffffff) + lVar50);
  lVar50 = -(lVar52 >> 0x3f);
  uVar62 = ((auVar39._8_8_ * 0x1000000 | uVar62 >> 0x28) * 0x1a5cf5d3ed +
            uVar60 * 0x14de + uVar63 * 0x10000000 + uVar58 * 0xa2f79cd658 +
            (auVar44._8_8_ * 0x100 | uVar61 >> 0x38) & 0xffffffffff) + lVar50;
  uVar57 = (lVar50 << 0x38) + lVar52;
  uVar59 = 0x10000000000;
  if (uVar62 <= uVar56) {
    uVar59 = 0;
  }
  lVar55 = (uVar59 | uVar56) - uVar62;
  uVar62 = uVar51 + 0xffed9ce5a30a2c13;
  uVar63 = uVar62 >> 0x3f;
  uVar59 = uVar53 - (uVar63 | 0xf9dea2f79cd658);
  uVar60 = uVar59 >> 0x3f;
  lVar52 = uVar54 - (uVar60 | 0x14de);
  lVar50 = lVar52 >> 0x3f;
  uVar58 = uVar57 + lVar50 >> 0x3f;
  uVar56 = uVar58 | 0x10000000;
  uVar35 = (-lVar50 << 0x38) + lVar52;
  uVar36 = (uVar63 << 0x38) + uVar62;
  uVar37 = (uVar60 << 0x38) + uVar59;
  uVar38 = lVar50 + uVar57 + (uVar58 << 0x38);
  if (lVar55 < (long)uVar56) {
    uVar56 = 0;
    uVar35 = uVar54;
    uVar36 = uVar51;
    uVar37 = uVar53;
    uVar38 = uVar57;
  }
  *z = uVar36;
  z[1] = uVar37;
  z[2] = uVar35;
  z[3] = uVar38;
  z[4] = lVar55 - uVar56;
  return;
}

Assistant:

static inline void barrett_reduction(uint64_t *z, uint64_t *t)
{
  uint64_t t0 = t[0U];
  uint64_t t1 = t[1U];
  uint64_t t2 = t[2U];
  uint64_t t3 = t[3U];
  uint64_t t4 = t[4U];
  uint64_t t5 = t[5U];
  uint64_t t6 = t[6U];
  uint64_t t7 = t[7U];
  uint64_t t8 = t[8U];
  uint64_t t9 = t[9U];
  uint64_t m00 = 0x12631a5cf5d3edULL;
  uint64_t m10 = 0xf9dea2f79cd658ULL;
  uint64_t m20 = 0x000000000014deULL;
  uint64_t m30 = 0x00000000000000ULL;
  uint64_t m40 = 0x00000010000000ULL;
  uint64_t m0 = m00;
  uint64_t m1 = m10;
  uint64_t m2 = m20;
  uint64_t m3 = m30;
  uint64_t m4 = m40;
  uint64_t m010 = 0x9ce5a30a2c131bULL;
  uint64_t m110 = 0x215d086329a7edULL;
  uint64_t m210 = 0xffffffffeb2106ULL;
  uint64_t m310 = 0xffffffffffffffULL;
  uint64_t m410 = 0x00000fffffffffULL;
  uint64_t mu0 = m010;
  uint64_t mu1 = m110;
  uint64_t mu2 = m210;
  uint64_t mu3 = m310;
  uint64_t mu4 = m410;
  uint64_t y_ = (t5 & 0xffffffULL) << 32U;
  uint64_t x_ = t4 >> 24U;
  uint64_t z00 = x_ | y_;
  uint64_t y_0 = (t6 & 0xffffffULL) << 32U;
  uint64_t x_0 = t5 >> 24U;
  uint64_t z10 = x_0 | y_0;
  uint64_t y_1 = (t7 & 0xffffffULL) << 32U;
  uint64_t x_1 = t6 >> 24U;
  uint64_t z20 = x_1 | y_1;
  uint64_t y_2 = (t8 & 0xffffffULL) << 32U;
  uint64_t x_2 = t7 >> 24U;
  uint64_t z30 = x_2 | y_2;
  uint64_t y_3 = (t9 & 0xffffffULL) << 32U;
  uint64_t x_3 = t8 >> 24U;
  uint64_t z40 = x_3 | y_3;
  uint64_t q0 = z00;
  uint64_t q1 = z10;
  uint64_t q2 = z20;
  uint64_t q3 = z30;
  uint64_t q4 = z40;
  FStar_UInt128_uint128 xy000 = FStar_UInt128_mul_wide(q0, mu0);
  FStar_UInt128_uint128 xy010 = FStar_UInt128_mul_wide(q0, mu1);
  FStar_UInt128_uint128 xy020 = FStar_UInt128_mul_wide(q0, mu2);
  FStar_UInt128_uint128 xy030 = FStar_UInt128_mul_wide(q0, mu3);
  FStar_UInt128_uint128 xy040 = FStar_UInt128_mul_wide(q0, mu4);
  FStar_UInt128_uint128 xy100 = FStar_UInt128_mul_wide(q1, mu0);
  FStar_UInt128_uint128 xy110 = FStar_UInt128_mul_wide(q1, mu1);
  FStar_UInt128_uint128 xy120 = FStar_UInt128_mul_wide(q1, mu2);
  FStar_UInt128_uint128 xy130 = FStar_UInt128_mul_wide(q1, mu3);
  FStar_UInt128_uint128 xy14 = FStar_UInt128_mul_wide(q1, mu4);
  FStar_UInt128_uint128 xy200 = FStar_UInt128_mul_wide(q2, mu0);
  FStar_UInt128_uint128 xy210 = FStar_UInt128_mul_wide(q2, mu1);
  FStar_UInt128_uint128 xy220 = FStar_UInt128_mul_wide(q2, mu2);
  FStar_UInt128_uint128 xy23 = FStar_UInt128_mul_wide(q2, mu3);
  FStar_UInt128_uint128 xy24 = FStar_UInt128_mul_wide(q2, mu4);
  FStar_UInt128_uint128 xy300 = FStar_UInt128_mul_wide(q3, mu0);
  FStar_UInt128_uint128 xy310 = FStar_UInt128_mul_wide(q3, mu1);
  FStar_UInt128_uint128 xy32 = FStar_UInt128_mul_wide(q3, mu2);
  FStar_UInt128_uint128 xy33 = FStar_UInt128_mul_wide(q3, mu3);
  FStar_UInt128_uint128 xy34 = FStar_UInt128_mul_wide(q3, mu4);
  FStar_UInt128_uint128 xy400 = FStar_UInt128_mul_wide(q4, mu0);
  FStar_UInt128_uint128 xy41 = FStar_UInt128_mul_wide(q4, mu1);
  FStar_UInt128_uint128 xy42 = FStar_UInt128_mul_wide(q4, mu2);
  FStar_UInt128_uint128 xy43 = FStar_UInt128_mul_wide(q4, mu3);
  FStar_UInt128_uint128 xy44 = FStar_UInt128_mul_wide(q4, mu4);
  FStar_UInt128_uint128 z01 = xy000;
  FStar_UInt128_uint128 z11 = FStar_UInt128_add_mod(xy010, xy100);
  FStar_UInt128_uint128 z21 = FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy020, xy110), xy200);
  FStar_UInt128_uint128
  z31 =
    FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy030, xy120), xy210),
      xy300);
  FStar_UInt128_uint128
  z41 =
    FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy040,
            xy130),
          xy220),
        xy310),
      xy400);
  FStar_UInt128_uint128
  z5 =
    FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy14, xy23), xy32),
      xy41);
  FStar_UInt128_uint128 z6 = FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy24, xy33), xy42);
  FStar_UInt128_uint128 z7 = FStar_UInt128_add_mod(xy34, xy43);
  FStar_UInt128_uint128 z8 = xy44;
  FStar_UInt128_uint128 carry0 = FStar_UInt128_shift_right(z01, 56U);
  FStar_UInt128_uint128 c00 = carry0;
  FStar_UInt128_uint128 carry1 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z11, c00), 56U);
  FStar_UInt128_uint128 c10 = carry1;
  FStar_UInt128_uint128 carry2 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z21, c10), 56U);
  FStar_UInt128_uint128 c20 = carry2;
  FStar_UInt128_uint128 carry3 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z31, c20), 56U);
  FStar_UInt128_uint128 c30 = carry3;
  FStar_UInt128_uint128 carry4 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z41, c30), 56U);
  uint64_t
  t100 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z41, c30)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c40 = carry4;
  uint64_t t410 = t100;
  FStar_UInt128_uint128 carry5 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z5, c40), 56U);
  uint64_t
  t101 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z5, c40)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c5 = carry5;
  uint64_t t51 = t101;
  FStar_UInt128_uint128 carry6 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z6, c5), 56U);
  uint64_t
  t102 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z6, c5)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c6 = carry6;
  uint64_t t61 = t102;
  FStar_UInt128_uint128 carry7 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z7, c6), 56U);
  uint64_t
  t103 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z7, c6)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c7 = carry7;
  uint64_t t71 = t103;
  FStar_UInt128_uint128 carry8 = FStar_UInt128_shift_right(FStar_UInt128_add_mod(z8, c7), 56U);
  uint64_t
  t104 = FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(z8, c7)) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c8 = carry8;
  uint64_t t81 = t104;
  uint64_t t91 = FStar_UInt128_uint128_to_uint64(c8);
  uint64_t qmu4_ = t410;
  uint64_t qmu5_ = t51;
  uint64_t qmu6_ = t61;
  uint64_t qmu7_ = t71;
  uint64_t qmu8_ = t81;
  uint64_t qmu9_ = t91;
  uint64_t y_4 = (qmu5_ & 0xffffffffffULL) << 16U;
  uint64_t x_4 = qmu4_ >> 40U;
  uint64_t z02 = x_4 | y_4;
  uint64_t y_5 = (qmu6_ & 0xffffffffffULL) << 16U;
  uint64_t x_5 = qmu5_ >> 40U;
  uint64_t z12 = x_5 | y_5;
  uint64_t y_6 = (qmu7_ & 0xffffffffffULL) << 16U;
  uint64_t x_6 = qmu6_ >> 40U;
  uint64_t z22 = x_6 | y_6;
  uint64_t y_7 = (qmu8_ & 0xffffffffffULL) << 16U;
  uint64_t x_7 = qmu7_ >> 40U;
  uint64_t z32 = x_7 | y_7;
  uint64_t y_8 = (qmu9_ & 0xffffffffffULL) << 16U;
  uint64_t x_8 = qmu8_ >> 40U;
  uint64_t z42 = x_8 | y_8;
  uint64_t qdiv0 = z02;
  uint64_t qdiv1 = z12;
  uint64_t qdiv2 = z22;
  uint64_t qdiv3 = z32;
  uint64_t qdiv4 = z42;
  uint64_t r0 = t0;
  uint64_t r1 = t1;
  uint64_t r2 = t2;
  uint64_t r3 = t3;
  uint64_t r4 = t4 & 0xffffffffffULL;
  FStar_UInt128_uint128 xy00 = FStar_UInt128_mul_wide(qdiv0, m0);
  FStar_UInt128_uint128 xy01 = FStar_UInt128_mul_wide(qdiv0, m1);
  FStar_UInt128_uint128 xy02 = FStar_UInt128_mul_wide(qdiv0, m2);
  FStar_UInt128_uint128 xy03 = FStar_UInt128_mul_wide(qdiv0, m3);
  FStar_UInt128_uint128 xy04 = FStar_UInt128_mul_wide(qdiv0, m4);
  FStar_UInt128_uint128 xy10 = FStar_UInt128_mul_wide(qdiv1, m0);
  FStar_UInt128_uint128 xy11 = FStar_UInt128_mul_wide(qdiv1, m1);
  FStar_UInt128_uint128 xy12 = FStar_UInt128_mul_wide(qdiv1, m2);
  FStar_UInt128_uint128 xy13 = FStar_UInt128_mul_wide(qdiv1, m3);
  FStar_UInt128_uint128 xy20 = FStar_UInt128_mul_wide(qdiv2, m0);
  FStar_UInt128_uint128 xy21 = FStar_UInt128_mul_wide(qdiv2, m1);
  FStar_UInt128_uint128 xy22 = FStar_UInt128_mul_wide(qdiv2, m2);
  FStar_UInt128_uint128 xy30 = FStar_UInt128_mul_wide(qdiv3, m0);
  FStar_UInt128_uint128 xy31 = FStar_UInt128_mul_wide(qdiv3, m1);
  FStar_UInt128_uint128 xy40 = FStar_UInt128_mul_wide(qdiv4, m0);
  FStar_UInt128_uint128 carry9 = FStar_UInt128_shift_right(xy00, 56U);
  uint64_t t105 = FStar_UInt128_uint128_to_uint64(xy00) & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c0 = carry9;
  uint64_t t010 = t105;
  FStar_UInt128_uint128
  carry10 =
    FStar_UInt128_shift_right(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy01, xy10), c0),
      56U);
  uint64_t
  t106 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy01, xy10), c0))
    & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c11 = carry10;
  uint64_t t110 = t106;
  FStar_UInt128_uint128
  carry11 =
    FStar_UInt128_shift_right(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy02,
            xy11),
          xy20),
        c11),
      56U);
  uint64_t
  t107 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy02,
            xy11),
          xy20),
        c11))
    & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c21 = carry11;
  uint64_t t210 = t107;
  FStar_UInt128_uint128
  carry =
    FStar_UInt128_shift_right(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy03,
              xy12),
            xy21),
          xy30),
        c21),
      56U);
  uint64_t
  t108 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy03,
              xy12),
            xy21),
          xy30),
        c21))
    & 0xffffffffffffffULL;
  FStar_UInt128_uint128 c31 = carry;
  uint64_t t310 = t108;
  uint64_t
  t411 =
    FStar_UInt128_uint128_to_uint64(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(FStar_UInt128_add_mod(xy04,
                xy13),
              xy22),
            xy31),
          xy40),
        c31))
    & 0xffffffffffULL;
  uint64_t qmul0 = t010;
  uint64_t qmul1 = t110;
  uint64_t qmul2 = t210;
  uint64_t qmul3 = t310;
  uint64_t qmul4 = t411;
  uint64_t b5 = (r0 - qmul0) >> 63U;
  uint64_t t109 = (b5 << 56U) + r0 - qmul0;
  uint64_t c1 = b5;
  uint64_t t011 = t109;
  uint64_t b6 = (r1 - (qmul1 + c1)) >> 63U;
  uint64_t t1010 = (b6 << 56U) + r1 - (qmul1 + c1);
  uint64_t c2 = b6;
  uint64_t t111 = t1010;
  uint64_t b7 = (r2 - (qmul2 + c2)) >> 63U;
  uint64_t t1011 = (b7 << 56U) + r2 - (qmul2 + c2);
  uint64_t c3 = b7;
  uint64_t t211 = t1011;
  uint64_t b8 = (r3 - (qmul3 + c3)) >> 63U;
  uint64_t t1012 = (b8 << 56U) + r3 - (qmul3 + c3);
  uint64_t c4 = b8;
  uint64_t t311 = t1012;
  uint64_t b9 = (r4 - (qmul4 + c4)) >> 63U;
  uint64_t t1013 = (b9 << 40U) + r4 - (qmul4 + c4);
  uint64_t t412 = t1013;
  uint64_t s0 = t011;
  uint64_t s1 = t111;
  uint64_t s2 = t211;
  uint64_t s3 = t311;
  uint64_t s4 = t412;
  uint64_t m01 = 0x12631a5cf5d3edULL;
  uint64_t m11 = 0xf9dea2f79cd658ULL;
  uint64_t m21 = 0x000000000014deULL;
  uint64_t m31 = 0x00000000000000ULL;
  uint64_t m41 = 0x00000010000000ULL;
  uint64_t y0 = m01;
  uint64_t y1 = m11;
  uint64_t y2 = m21;
  uint64_t y3 = m31;
  uint64_t y4 = m41;
  uint64_t b10 = (s0 - y0) >> 63U;
  uint64_t t1014 = (b10 << 56U) + s0 - y0;
  uint64_t b0 = b10;
  uint64_t t01 = t1014;
  uint64_t b11 = (s1 - (y1 + b0)) >> 63U;
  uint64_t t1015 = (b11 << 56U) + s1 - (y1 + b0);
  uint64_t b1 = b11;
  uint64_t t11 = t1015;
  uint64_t b12 = (s2 - (y2 + b1)) >> 63U;
  uint64_t t1016 = (b12 << 56U) + s2 - (y2 + b1);
  uint64_t b2 = b12;
  uint64_t t21 = t1016;
  uint64_t b13 = (s3 - (y3 + b2)) >> 63U;
  uint64_t t1017 = (b13 << 56U) + s3 - (y3 + b2);
  uint64_t b3 = b13;
  uint64_t t31 = t1017;
  uint64_t b = (s4 - (y4 + b3)) >> 63U;
  uint64_t t10 = (b << 56U) + s4 - (y4 + b3);
  uint64_t b4 = b;
  uint64_t t41 = t10;
  uint64_t mask = b4 - 1ULL;
  uint64_t z03 = s0 ^ (mask & (s0 ^ t01));
  uint64_t z13 = s1 ^ (mask & (s1 ^ t11));
  uint64_t z23 = s2 ^ (mask & (s2 ^ t21));
  uint64_t z33 = s3 ^ (mask & (s3 ^ t31));
  uint64_t z43 = s4 ^ (mask & (s4 ^ t41));
  uint64_t z04 = z03;
  uint64_t z14 = z13;
  uint64_t z24 = z23;
  uint64_t z34 = z33;
  uint64_t z44 = z43;
  uint64_t o0 = z04;
  uint64_t o1 = z14;
  uint64_t o2 = z24;
  uint64_t o3 = z34;
  uint64_t o4 = z44;
  uint64_t z0 = o0;
  uint64_t z1 = o1;
  uint64_t z2 = o2;
  uint64_t z3 = o3;
  uint64_t z4 = o4;
  z[0U] = z0;
  z[1U] = z1;
  z[2U] = z2;
  z[3U] = z3;
  z[4U] = z4;
}